

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

xmlChar * xmlParseSystemLiteral(xmlParserCtxtPtr ctxt)

{
  int max;
  int iVar1;
  xmlChar *pxVar2;
  bool bVar3;
  int newSize;
  xmlChar *tmp;
  int iStack_30;
  xmlChar stop;
  int maxLength;
  int l;
  int cur;
  int size;
  int len;
  xmlChar *buf;
  xmlParserCtxtPtr ctxt_local;
  
  _size = (xmlChar *)0x0;
  cur = 0;
  l = 100;
  max = 50000;
  if ((ctxt->options & 0x80000U) != 0) {
    max = 10000000;
  }
  buf = (xmlChar *)ctxt;
  if (*ctxt->input->cur == '\"') {
    xmlNextChar(ctxt);
    tmp._3_1_ = 0x22;
  }
  else {
    if (*ctxt->input->cur != '\'') {
      xmlFatalErr(ctxt,XML_ERR_LITERAL_NOT_STARTED,(char *)0x0);
      return (xmlChar *)0x0;
    }
    xmlNextChar(ctxt);
    tmp._3_1_ = 0x27;
  }
  _size = (xmlChar *)(*xmlMalloc)((long)l);
  if (_size == (xmlChar *)0x0) {
    xmlErrMemory((xmlParserCtxtPtr)buf);
    return (xmlChar *)0x0;
  }
  maxLength = xmlCurrentCharRecover((xmlParserCtxtPtr)buf,&stack0xffffffffffffffd0);
  do {
    if (maxLength < 0x100) {
      if (((8 < maxLength) && (maxLength < 0xb)) ||
         ((maxLength == 0xd || (bVar3 = false, 0x1f < maxLength)))) {
LAB_0013c5d0:
        bVar3 = maxLength != (uint)tmp._3_1_;
      }
    }
    else if ((((0xff < maxLength) && (maxLength < 0xd800)) ||
             ((0xdfff < maxLength && (maxLength < 0xfffe)))) ||
            ((bVar3 = false, 0xffff < maxLength && (bVar3 = false, maxLength < 0x110000))))
    goto LAB_0013c5d0;
    if (!bVar3) {
      _size[cur] = '\0';
      if (maxLength < 0x100) {
        if (((8 < maxLength) && (maxLength < 0xb)) || ((maxLength == 0xd || (0x1f < maxLength)))) {
LAB_0013c7d6:
          xmlNextChar((xmlParserCtxtPtr)buf);
          return _size;
        }
      }
      else if ((((0xff < maxLength) && (maxLength < 0xd800)) ||
               ((0xdfff < maxLength && (maxLength < 0xfffe)))) ||
              ((0xffff < maxLength && (maxLength < 0x110000)))) goto LAB_0013c7d6;
      xmlFatalErr((xmlParserCtxtPtr)buf,XML_ERR_LITERAL_NOT_FINISHED,(char *)0x0);
      return _size;
    }
    iVar1 = l;
    pxVar2 = _size;
    if (l <= cur + 5) {
      iVar1 = xmlGrowCapacity(l,1,1,max);
      if (iVar1 < 0) {
        xmlFatalErr((xmlParserCtxtPtr)buf,XML_ERR_NAME_TOO_LONG,"SystemLiteral");
        (*xmlFree)(_size);
        return (xmlChar *)0x0;
      }
      pxVar2 = (xmlChar *)(*xmlRealloc)(_size,(long)iVar1);
      if (pxVar2 == (xmlChar *)0x0) {
        (*xmlFree)(_size);
        xmlErrMemory((xmlParserCtxtPtr)buf);
        return (xmlChar *)0x0;
      }
    }
    _size = pxVar2;
    l = iVar1;
    if (maxLength < 0x80) {
      _size[cur] = (xmlChar)maxLength;
      cur = cur + 1;
    }
    else {
      iVar1 = xmlCopyCharMultiByte(_size + cur,maxLength);
      cur = iVar1 + cur;
    }
    if (**(char **)(*(long *)(buf + 0x38) + 0x20) == '\n') {
      *(int *)(*(long *)(buf + 0x38) + 0x34) = *(int *)(*(long *)(buf + 0x38) + 0x34) + 1;
      *(undefined4 *)(*(long *)(buf + 0x38) + 0x38) = 1;
    }
    else {
      *(int *)(*(long *)(buf + 0x38) + 0x38) = *(int *)(*(long *)(buf + 0x38) + 0x38) + 1;
    }
    *(long *)(*(long *)(buf + 0x38) + 0x20) =
         *(long *)(*(long *)(buf + 0x38) + 0x20) + (long)iStack_30;
    maxLength = xmlCurrentCharRecover((xmlParserCtxtPtr)buf,&stack0xffffffffffffffd0);
  } while( true );
}

Assistant:

xmlChar *
xmlParseSystemLiteral(xmlParserCtxtPtr ctxt) {
    xmlChar *buf = NULL;
    int len = 0;
    int size = XML_PARSER_BUFFER_SIZE;
    int cur, l;
    int maxLength = (ctxt->options & XML_PARSE_HUGE) ?
                    XML_MAX_TEXT_LENGTH :
                    XML_MAX_NAME_LENGTH;
    xmlChar stop;

    if (RAW == '"') {
        NEXT;
	stop = '"';
    } else if (RAW == '\'') {
        NEXT;
	stop = '\'';
    } else {
	xmlFatalErr(ctxt, XML_ERR_LITERAL_NOT_STARTED, NULL);
	return(NULL);
    }

    buf = xmlMalloc(size);
    if (buf == NULL) {
        xmlErrMemory(ctxt);
	return(NULL);
    }
    cur = xmlCurrentCharRecover(ctxt, &l);
    while ((IS_CHAR(cur)) && (cur != stop)) { /* checked */
	if (len + 5 >= size) {
	    xmlChar *tmp;
            int newSize;

            newSize = xmlGrowCapacity(size, 1, 1, maxLength);
            if (newSize < 0) {
                xmlFatalErr(ctxt, XML_ERR_NAME_TOO_LONG, "SystemLiteral");
                xmlFree(buf);
                return(NULL);
            }
	    tmp = xmlRealloc(buf, newSize);
	    if (tmp == NULL) {
	        xmlFree(buf);
		xmlErrMemory(ctxt);
		return(NULL);
	    }
	    buf = tmp;
            size = newSize;
	}
	COPY_BUF(buf, len, cur);
	NEXTL(l);
	cur = xmlCurrentCharRecover(ctxt, &l);
    }
    buf[len] = 0;
    if (!IS_CHAR(cur)) {
	xmlFatalErr(ctxt, XML_ERR_LITERAL_NOT_FINISHED, NULL);
    } else {
	NEXT;
    }
    return(buf);
}